

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  pointer puVar1;
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> this_00;
  cmMakefile *this_01;
  bool bVar2;
  string *type;
  string *path;
  cmExtraKateGenerator *this_02;
  allocator<char> local_99;
  string local_98;
  string local_78 [32];
  string local_58;
  string local_38;
  
  puVar1 = (((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
  super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
       (puVar1->_M_t).
       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
  this_01 = *(cmMakefile **)
             ((long)this_00._M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 0x70);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_58,
             (cmLocalGenerator *)
             this_00._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"CMAKE_BUILD_TYPE",&local_99);
  this_02 = (cmExtraKateGenerator *)local_78;
  type = cmMakefile::GetSafeDefinition(this_01,(string *)this_02);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                   ((cmLocalGenerator *)
                    (puVar1->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t);
  GetPathBasename(&local_98,this_02,path);
  GenerateProjectName(&local_38,this_02,&local_58,type,&local_98);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_38);
  bVar2 = std::operator==(&local_38,"Ninja");
  this->UseNinja = bVar2;
  std::__cxx11::string::~string((string *)&local_38);
  CreateKateProjectFile
            (this,(cmLocalGenerator *)
                  (puVar1->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t);
  CreateDummyKateProjectFile
            (this,(cmLocalGenerator *)
                  (puVar1->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();
  this->ProjectName = this->GenerateProjectName(
    lg->GetProjectName(), mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
    this->GetPathBasename(lg->GetBinaryDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(*lg);
  this->CreateDummyKateProjectFile(*lg);
}